

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O0

level_conflict * level_by_name(level_map *map,char *name)

{
  level_conflict *plVar1;
  int iVar2;
  char *__s2;
  level_conflict *lev;
  wchar_t i;
  char *name_local;
  level_map *map_local;
  
  lev._4_4_ = 0;
  while( true ) {
    if (map->num_levels <= lev._4_4_) {
      return (level_conflict *)0x0;
    }
    plVar1 = map->levels;
    __s2 = level_name(plVar1 + lev._4_4_);
    iVar2 = strcmp(name,__s2);
    if (iVar2 == 0) break;
    lev._4_4_ = lev._4_4_ + 1;
  }
  return plVar1 + lev._4_4_;
}

Assistant:

struct level *level_by_name(struct level_map *map, const char *name)
{
	int i;
	for (i = 0; i < map->num_levels; i++) {
		struct level *lev = &map->levels[i];
		if (streq(name, level_name(lev))) {
			return lev;
		}
	}
	return NULL;
}